

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkOptionsCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ab77fb::TargetLinkOptionsImpl::HandleDirectContent
          (TargetLinkOptionsImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  cmListFileBacktrace local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68;
  undefined1 local_38 [8];
  cmListFileBacktrace lfbt;
  bool param_4_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetLinkOptionsImpl *this_local;
  
  lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._6_1_ = param_4;
  lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = prepend;
  cmMakefile::GetBacktrace((cmMakefile *)local_38);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(&local_88,this,content);
  cmListFileBacktrace::cmListFileBacktrace(local_a8,(cmListFileBacktrace *)local_38);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_68,&local_88,local_a8);
  cmTarget::InsertLinkOption
            (tgt,&local_68,
             (bool)(lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._7_1_ & 1));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_68);
  cmListFileBacktrace::~cmListFileBacktrace(local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool prepend, bool /*system*/) override
  {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    tgt->InsertLinkOption(BT<std::string>(this->Join(content), lfbt), prepend);
    return true; // Successfully handled.
  }